

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt
strscan_bin(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  uint64_t local_50;
  uint local_48;
  uint local_44;
  uint32_t local_3c;
  ulong uStack_38;
  uint32_t i;
  uint64_t x;
  int32_t neg_local;
  int32_t ex2_local;
  uint32_t opt_local;
  StrScanFmt fmt_local;
  TValue *o_local;
  uint8_t *p_local;
  
  uStack_38 = 0;
  if ((ex2 != 0) || (0x40 < dig)) {
    return STRSCAN_ERROR;
  }
  o_local = (TValue *)p;
  for (local_3c = dig; local_3c != 0; local_3c = local_3c - 1) {
    if (((ulong)*o_local & 0xfe) != 0x30) {
      return STRSCAN_ERROR;
    }
    uStack_38 = uStack_38 << 1 | (long)(int)(*(byte *)o_local & 1);
    o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
  }
  local_48 = (uint)uStack_38;
  if (fmt == STRSCAN_INT) {
    if (((opt & 2) == 0) && (uStack_38 < neg + 0x80000000)) {
      local_44 = local_48;
      if (neg != 0) {
        local_44 = (local_48 ^ 0xffffffff) + 1;
      }
      (o->field_4).i = local_44;
      return STRSCAN_INT;
    }
    if ((opt & 0x10) != 0) goto LAB_001484bd;
    ex2_local = 1;
  }
  else {
    if (fmt == STRSCAN_U32) {
LAB_001484bd:
      if (0x20 < dig) {
        return STRSCAN_ERROR;
      }
      if (neg != 0) {
        local_48 = (local_48 ^ 0xffffffff) + 1;
      }
      (o->field_4).i = local_48;
      return STRSCAN_U32;
    }
    ex2_local = fmt;
    if (fmt - STRSCAN_I64 < 2) {
      if (neg == 0) {
        local_50 = uStack_38;
      }
      else {
        local_50 = (uStack_38 ^ 0xffffffffffffffff) + 1;
      }
      o->u64 = local_50;
      return fmt;
    }
  }
  x._4_4_ = 0;
  if ((uStack_38 & 0xc000000000000000) != 0) {
    uStack_38 = uStack_38 >> 2 | uStack_38 & 3;
    x._4_4_ = 2;
  }
  strscan_double(uStack_38,o,x._4_4_,neg);
  return ex2_local;
}

Assistant:

static StrScanFmt strscan_bin(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  if (ex2 || dig > 64) return STRSCAN_ERROR;

  /* Scan binary digits. */
  for (i = dig; i; i--, p++) {
    if ((*p & ~1) != '0') return STRSCAN_ERROR;
    x = (x << 1) | (*p & 1);
  }

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
      o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 32) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    o->u64 = neg ? ~x+1u : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range, then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}